

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O1

void __thiscall
test::test_generate_export_import_and_sign::test_method(test_generate_export_import_and_sign *this)

{
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  string signature;
  string pk;
  long *local_c0;
  undefined1 **local_b8;
  undefined1 local_b0;
  undefined1 *local_a8;
  char *local_a0;
  undefined1 local_98;
  undefined8 local_90;
  shared_count sStack_88;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  char *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  
  license::CryptoHelper::getInstance();
  (**(code **)*local_c0)();
  (**(code **)(*local_c0 + 8))(local_60);
  (**(code **)(*local_c0 + 0x20))(local_c0,local_60);
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"testString","");
  (**(code **)(*local_c0 + 0x28))(&local_80,local_c0,&local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  local_20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_18 = "";
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_28 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x71);
  local_98 = local_78 == 0xac;
  local_90 = 0;
  sStack_88.pi_ = (sp_counted_base *)0x0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_00542db8;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "signature is the right size";
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_38 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_88);
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_generate_export_import_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->generateKeyPair();
	const string pk = crypto->exportPrivateKey();
	crypto->loadPrivateKey(pk);
	const string signature = crypto->signString("testString");
	//(1024/8)*(4/3)+4 (base64)
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	crypto.release();
}